

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<float>::DeterminantInverse
          (TPZFMatrix<float> *this,float *determinant,TPZFMatrix<float> *inverse)

{
  int iVar1;
  long lVar2;
  TPZFMatrix<float> local_258;
  float local_1c8 [102];
  
  local_258.fElem = local_1c8;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185e9a0;
  local_258.fSize = 100;
  local_258.fGiven = local_258.fElem;
  TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
  local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
  local_258.fPivot.super_TPZVec<int>.fNElements = 0;
  local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_258.fWork.fStore = (float *)0x0;
  local_258.fWork.fNElements = 0;
  local_258.fWork.fNAlloc = 0;
  local_258.fElem = (float *)0x0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185e6b0;
  operator=(&local_258,this);
  (*(inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (inverse);
  if (0 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) {
    lVar2 = 0;
    do {
      if (((inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar2)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      inverse->fElem[(inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow * lVar2 + lVar2] =
           1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  }
  iVar1 = (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x10])();
  if (iVar1 != 0) {
    TPZMatrix<float>::Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
  }
  iVar1 = (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x17])();
  if (iVar1 != 0) {
    (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x43])
              (&local_258,inverse);
  }
  *determinant = 1.0;
  if (0 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) {
    lVar2 = 0;
    do {
      if ((local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar2) ||
         (local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar2)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *determinant = local_258.fElem
                     [local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar2 + lVar2] *
                     *determinant;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  }
  ~TPZFMatrix(&local_258,&PTR_PTR_0185e968);
  return;
}

Assistant:

void TPZFMatrix<TVar>::DeterminantInverse(TVar &determinant, TPZFMatrix<TVar> &inverse)
{
    TPZFNMatrix<100, TVar> copy(*this);
    inverse.Redim(this->Rows(),this->Rows());
    int64_t r;
    for(r=0; r<this->Rows(); r++) inverse(r,r) = 1.;
    copy.Solve_LU(&inverse);
    determinant = 1.;
    for(r=0; r<this->Rows(); r++) determinant *= copy(r,r);
}